

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O2

CodeLocation __thiscall
soul::CodeLocation::createFromString(CodeLocation *this,string *filename,string *text)

{
  UTF8Reader extraout_RDX;
  CodeLocation CVar1;
  Ptr PStack_68;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)filename);
  std::__cxx11::string::string((string *)&local_60,(string *)text);
  SourceCodeText::createForFile((SourceCodeText *)&PStack_68,&local_40,&local_60);
  CodeLocation(this,&PStack_68);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&PStack_68);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  validateUTF8(this);
  CVar1.location.data = extraout_RDX.data;
  CVar1.sourceCode.object = (SourceCodeText *)this;
  return CVar1;
}

Assistant:

CodeLocation CodeLocation::createFromString (std::string filename, std::string text)
{
    CodeLocation code (SourceCodeText::createForFile (std::move (filename), std::move (text)));
    code.validateUTF8();
    return code;
}